

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# videomenu.cpp
# Opt level: O2

void M_InitVideoModesMenu(void)

{
  IVideo *pIVar1;
  uint uVar2;
  int iVar3;
  uint i;
  uint uVar4;
  ulong uVar5;
  int dummy2;
  int dummy1;
  
  M_RefreshModesList();
  if (vid_tft.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
    (*vid_tft.super_FBaseCVar.m_Callback)(&vid_tft.super_FBaseCVar);
  }
  uVar4 = 1;
  uVar5 = 0;
  while ((pIVar1 = Video, uVar4 < 0x21 && (uVar5 < 0x20))) {
    uVar2 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x21])();
    (*pIVar1->_vptr_IVideo[5])(pIVar1,(ulong)uVar4,(ulong)(uVar2 & 0xff));
    iVar3 = (*Video->_vptr_IVideo[6])(Video,&dummy1,&dummy2,0);
    if ((char)iVar3 != '\0') {
      BitTranslate[uVar5] = (BYTE)uVar4;
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void M_InitVideoModesMenu ()
{
	int dummy1, dummy2;
	size_t currval = 0;

	M_RefreshModesList();
	vid_tft.Callback();

	for (unsigned int i = 1; i <= 32 && currval < countof(BitTranslate); i++)
	{
		Video->StartModeIterator (i, screen->IsFullscreen());
		if (Video->NextMode (&dummy1, &dummy2, NULL))
		{
			BitTranslate[currval++] = i;
		}
	}

	/* It doesn't look like this can be anything but DISPLAY_Both, regardless of any other settings.
	switch (Video->GetDisplayType ())
	{
	case DISPLAY_FullscreenOnly:
	case DISPLAY_WindowOnly:
		// todo: gray out fullscreen option
	default:
		break;
	}
	*/
}